

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O0

IOTHUB_MESSAGING_RESULT
IoTHubMessaging_LL_Send
          (IOTHUB_MESSAGING_HANDLE messagingHandle,char *deviceId,IOTHUB_MESSAGE_HANDLE message,
          IOTHUB_SEND_COMPLETE_CALLBACK sendCompleteCallback,void *userContextCallback)

{
  BINARY_DATA amqp_data;
  _Bool _Var1;
  int iVar2;
  LOGGER_LOG p_Var3;
  MESSAGE_HANDLE message_00;
  AMQP_VALUE to_amqp_value_00;
  SEND_CALLBACK_DATA *send_data_00;
  ASYNC_OPERATION_HANDLE pAVar4;
  LOGGER_LOG l_13;
  LOGGER_LOG l_12;
  SEND_CALLBACK_DATA *send_data;
  LOGGER_LOG l_11;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  BINARY_DATA binary_data;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  AMQP_VALUE to_amqp_value;
  MESSAGE_HANDLE amqpMessage;
  LOGGER_LOG l_6;
  size_t messageContentSize;
  uchar *messageContent;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  char *deviceDestinationString;
  char *moduleId;
  void *pvStack_30;
  IOTHUB_MESSAGING_RESULT result;
  void *userContextCallback_local;
  IOTHUB_SEND_COMPLETE_CALLBACK sendCompleteCallback_local;
  IOTHUB_MESSAGE_HANDLE message_local;
  char *deviceId_local;
  IOTHUB_MESSAGING_HANDLE messagingHandle_local;
  
  deviceDestinationString = (char *)0x0;
  pvStack_30 = userContextCallback;
  userContextCallback_local = sendCompleteCallback;
  sendCompleteCallback_local = (IOTHUB_SEND_COMPLETE_CALLBACK)message;
  message_local = (IOTHUB_MESSAGE_HANDLE)deviceId;
  deviceId_local = (char *)messagingHandle;
  if (messagingHandle == (IOTHUB_MESSAGING_HANDLE)0x0) {
    l_1 = xlogging_get_log_function();
    if (l_1 != (LOGGER_LOG)0x0) {
      (*l_1)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
             ,"IoTHubMessaging_LL_Send",0x5a6,1,"Input parameter messagingHandle cannot be NULL");
    }
    moduleId._4_4_ = IOTHUB_MESSAGING_INVALID_ARG;
  }
  else if (deviceId == (char *)0x0) {
    l_2 = xlogging_get_log_function();
    if (l_2 != (LOGGER_LOG)0x0) {
      (*l_2)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
             ,"IoTHubMessaging_LL_Send",0x5ab,1,"Input parameter deviceId cannot be NULL");
    }
    moduleId._4_4_ = IOTHUB_MESSAGING_INVALID_ARG;
  }
  else if (message == (IOTHUB_MESSAGE_HANDLE)0x0) {
    l_3 = xlogging_get_log_function();
    if (l_3 != (LOGGER_LOG)0x0) {
      (*l_3)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
             ,"IoTHubMessaging_LL_Send",0x5b0,1,"Input parameter message cannot be NULL");
    }
    moduleId._4_4_ = IOTHUB_MESSAGING_INVALID_ARG;
  }
  else if (messagingHandle->isOpened == 0) {
    l_4 = xlogging_get_log_function();
    if (l_4 != (LOGGER_LOG)0x0) {
      (*l_4)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
             ,"IoTHubMessaging_LL_Send",0x5b5,1,
             "Messaging is not opened - call IoTHubMessaging_LL_Open to open");
    }
    moduleId._4_4_ = IOTHUB_MESSAGING_ERROR;
  }
  else {
    _Var1 = is_send_queue_full(messagingHandle);
    if (_Var1) {
      l_5 = xlogging_get_log_function();
      if (l_5 != (LOGGER_LOG)0x0) {
        (*l_5)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
               ,"IoTHubMessaging_LL_Send",0x5ba,1,"Send queue is full");
      }
      moduleId._4_4_ = IOTHUB_MESSAGING_QUEUE_FULL;
    }
    else {
      l = (LOGGER_LOG)createDeviceDestinationString((char *)message_local,deviceDestinationString);
      if (l == (LOGGER_LOG)0x0) {
        messageContent = (uchar *)xlogging_get_log_function();
        if ((LOGGER_LOG)messageContent != (LOGGER_LOG)0x0) {
          (*(code *)messageContent)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                     ,"IoTHubMessaging_LL_Send",0x5bf,1,"Could not create a message.");
        }
        moduleId._4_4_ = IOTHUB_MESSAGING_ERROR;
      }
      else {
        iVar2 = getMessageContentAndSize
                          ((IOTHUB_MESSAGE_HANDLE)sendCompleteCallback_local,
                           (uchar **)&messageContentSize,(size_t *)&l_6);
        if (iVar2 == 0) {
          message_00 = message_create();
          if (message_00 == (MESSAGE_HANDLE)0x0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                        ,"IoTHubMessaging_LL_Send",0x5d3,1,"Could not create a message.");
            }
            moduleId._4_4_ = IOTHUB_MESSAGING_ERROR;
          }
          else {
            to_amqp_value_00 = amqpvalue_create_string((char *)l);
            if (to_amqp_value_00 == (AMQP_VALUE)0x0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                          ,"IoTHubMessaging_LL_Send",0x5da,1,
                          "Could not create properties for message - amqpvalue_create_string");
              }
              moduleId._4_4_ = IOTHUB_MESSAGING_ERROR;
            }
            else {
              amqp_data.length = (size_t)l_6;
              amqp_data.bytes = (uchar *)messageContentSize;
              iVar2 = message_add_body_amqp_data(message_00,amqp_data);
              if (iVar2 == 0) {
                iVar2 = addPropertiesToAMQPMessage
                                  ((IOTHUB_MESSAGE_HANDLE)sendCompleteCallback_local,message_00,
                                   to_amqp_value_00);
                if (iVar2 == 0) {
                  iVar2 = addApplicationPropertiesToAMQPMessage
                                    ((IOTHUB_MESSAGE_HANDLE)sendCompleteCallback_local,message_00);
                  if (iVar2 == 0) {
                    send_data_00 = enqueue_send_callback_data
                                             ((IOTHUB_MESSAGING_HANDLE)deviceId_local,
                                              (IOTHUB_SEND_COMPLETE_CALLBACK)
                                              userContextCallback_local,pvStack_30);
                    if (send_data_00 == (SEND_CALLBACK_DATA *)0x0) {
                      p_Var3 = xlogging_get_log_function();
                      if (p_Var3 != (LOGGER_LOG)0x0) {
                        (*p_Var3)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                  ,"IoTHubMessaging_LL_Send",0x5fa,1,"Failed enqueueing message.");
                      }
                      moduleId._4_4_ = IOTHUB_MESSAGING_ERROR;
                    }
                    else {
                      pAVar4 = messagesender_send_async
                                         (*(MESSAGE_SENDER_HANDLE *)(deviceId_local + 0x38),
                                          message_00,IoTHubMessaging_LL_SendMessageComplete,
                                          send_data_00,0);
                      if (pAVar4 == (ASYNC_OPERATION_HANDLE)0x0) {
                        p_Var3 = xlogging_get_log_function();
                        if (p_Var3 != (LOGGER_LOG)0x0) {
                          (*p_Var3)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                    ,"IoTHubMessaging_LL_Send",0x5ff,1,
                                    "messagesender_send_async failed.");
                        }
                        dequeue_send_callback_data(send_data_00);
                        moduleId._4_4_ = IOTHUB_MESSAGING_ERROR;
                      }
                      else {
                        moduleId._4_4_ = IOTHUB_MESSAGING_OK;
                      }
                    }
                  }
                  else {
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      (*p_Var3)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                ,"IoTHubMessaging_LL_Send",0x5f1,1,
                                "Failed setting application properties of the uAMQP message.");
                    }
                    moduleId._4_4_ = IOTHUB_MESSAGING_ERROR;
                  }
                }
                else {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    (*p_Var3)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                              ,"IoTHubMessaging_LL_Send",0x5ec,1,
                              "Failed setting properties of the uAMQP message.");
                  }
                  moduleId._4_4_ = IOTHUB_MESSAGING_ERROR;
                }
              }
              else {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                            ,"IoTHubMessaging_LL_Send",0x5e7,1,
                            "Failed setting the body of the uAMQP message.");
                }
                moduleId._4_4_ = IOTHUB_MESSAGING_ERROR;
              }
              amqpvalue_destroy(to_amqp_value_00);
            }
            message_destroy(message_00);
          }
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                      ,"IoTHubMessaging_LL_Send",0x5c9,1,
                      "Failed getting the message content and message size from IOTHUB_MESSAGE_HANDLE instance."
                     );
          }
          moduleId._4_4_ = IOTHUB_MESSAGING_ERROR;
        }
        free(l);
      }
    }
  }
  return moduleId._4_4_;
}

Assistant:

IOTHUB_MESSAGING_RESULT IoTHubMessaging_LL_Send(IOTHUB_MESSAGING_HANDLE messagingHandle, const char* deviceId, IOTHUB_MESSAGE_HANDLE message, IOTHUB_SEND_COMPLETE_CALLBACK sendCompleteCallback, void* userContextCallback)
{
    IOTHUB_MESSAGING_RESULT result;

    // There is no support for module sending message for callers, but most of plumbing is available should this be enabled via a new API.
    const char* moduleId = NULL;

    char* deviceDestinationString;

    if (messagingHandle == NULL)
    {
        LogError("Input parameter messagingHandle cannot be NULL");
        result = IOTHUB_MESSAGING_INVALID_ARG;
    }
    else if (deviceId == NULL)
    {
        LogError("Input parameter deviceId cannot be NULL");
        result = IOTHUB_MESSAGING_INVALID_ARG;
    }
    else if (message == NULL)
    {
        LogError("Input parameter message cannot be NULL");
        result = IOTHUB_MESSAGING_INVALID_ARG;
    }
    else if (messagingHandle->isOpened == 0)
    {
        LogError("Messaging is not opened - call IoTHubMessaging_LL_Open to open");
        result = IOTHUB_MESSAGING_ERROR;
    }
    else if (is_send_queue_full(messagingHandle))
    {
        LogError("Send queue is full");
        result = IOTHUB_MESSAGING_QUEUE_FULL;
    }
    else if ((deviceDestinationString = createDeviceDestinationString(deviceId, moduleId)) == NULL)
    {
        LogError("Could not create a message.");
        result = IOTHUB_MESSAGING_ERROR;
    }
    else
    {
        unsigned const char* messageContent;
        size_t messageContentSize;

        if (getMessageContentAndSize(message, &messageContent, &messageContentSize) != 0)
        {
            LogError("Failed getting the message content and message size from IOTHUB_MESSAGE_HANDLE instance.");
            result = IOTHUB_MESSAGING_ERROR;
        }
        else
        {
            MESSAGE_HANDLE amqpMessage;
            AMQP_VALUE to_amqp_value;

            if ((amqpMessage = message_create()) == NULL)
            {
                LogError("Could not create a message.");
                result = IOTHUB_MESSAGING_ERROR;
            }
            else
            {
                if ((to_amqp_value = amqpvalue_create_string(deviceDestinationString)) == NULL)
                {
                    LogError("Could not create properties for message - amqpvalue_create_string");
                    result = IOTHUB_MESSAGING_ERROR;
                }
                else
                {
                    BINARY_DATA binary_data;

                    binary_data.bytes = messageContent;
                    binary_data.length = messageContentSize;

                    if (message_add_body_amqp_data(amqpMessage, binary_data) != 0)
                    {
                        
                        LogError("Failed setting the body of the uAMQP message.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (addPropertiesToAMQPMessage(message, amqpMessage, to_amqp_value) != 0)
                    {
                        LogError("Failed setting properties of the uAMQP message.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (addApplicationPropertiesToAMQPMessage(message, amqpMessage) != 0)
                    {
                        LogError("Failed setting application properties of the uAMQP message.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else
                    {
                        SEND_CALLBACK_DATA* send_data = enqueue_send_callback_data(messagingHandle, sendCompleteCallback, userContextCallback);

                        if (send_data == NULL)
                        {
                            LogError("Failed enqueueing message.");
                            result = IOTHUB_MESSAGING_ERROR;
                        }
                        else if (messagesender_send_async(messagingHandle->message_sender, amqpMessage, IoTHubMessaging_LL_SendMessageComplete, send_data, 0) == NULL)
                        {
                            LogError("messagesender_send_async failed.");
                            dequeue_send_callback_data(send_data);
                            result = IOTHUB_MESSAGING_ERROR;
                        }
                        else
                        {
                            result = IOTHUB_MESSAGING_OK;
                        }
                    }
                    amqpvalue_destroy(to_amqp_value);
                }
                message_destroy(amqpMessage);
            }
        }
        free(deviceDestinationString);
    }
    return result;
}